

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_scan.hpp
# Opt level: O1

void __thiscall
duckdb::PatasScanState<double>::PatasScanState(PatasScanState<double> *this,ColumnSegment *segment)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  BufferManager *pBVar4;
  BufferHandle BStack_38;
  
  (this->super_SegmentScanState)._vptr_SegmentScanState =
       (_func_int **)&PTR__PatasScanState_019ac4a8;
  BufferHandle::BufferHandle(&this->handle);
  this->total_value_count = 0;
  (this->group_state).byte_reader.buffer = (uint8_t *)0x0;
  (this->group_state).byte_reader.index = 0;
  this->segment = segment;
  this->count = (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
                super___atomic_base<unsigned_long>._M_i;
  pBVar4 = BufferManager::GetBufferManager(segment->db);
  (*pBVar4->_vptr_BufferManager[7])(&BStack_38,pBVar4,&segment->block);
  BufferHandle::operator=(&this->handle,&BStack_38);
  BufferHandle::~BufferHandle(&BStack_38);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->handle).node);
  pdVar2 = ((this->handle).node.ptr)->buffer;
  iVar3 = segment->offset;
  pdVar1 = pdVar2 + iVar3;
  this->segment_data = pdVar1;
  this->metadata_ptr = pdVar1 + *(uint *)(pdVar2 + iVar3);
  return;
}

Assistant:

explicit PatasScanState(ColumnSegment &segment) : segment(segment), count(segment.count) {
		auto &buffer_manager = BufferManager::GetBufferManager(segment.db);

		handle = buffer_manager.Pin(segment.block);
		// ScanStates never exceed the boundaries of a Segment,
		// but are not guaranteed to start at the beginning of the Block
		segment_data = handle.Ptr() + segment.GetBlockOffset();
		auto metadata_offset = Load<uint32_t>(segment_data);
		metadata_ptr = segment_data + metadata_offset;
	}